

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__compute_transparency(stbi__png *z,stbi_uc *tc,int out_n)

{
  stbi_uc sVar1;
  uint uVar2;
  stbi_uc *local_38;
  stbi_uc *p;
  stbi__uint32 pixel_count;
  stbi__uint32 i;
  stbi__context *s;
  int out_n_local;
  stbi_uc *tc_local;
  stbi__png *z_local;
  
  uVar2 = z->s->img_x * z->s->img_y;
  local_38 = z->out;
  if (out_n != 2 && out_n != 4) {
    __assert_fail("out_n == 2 || out_n == 4",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/stb/stb_image.h"
                  ,0x1235,"int stbi__compute_transparency(stbi__png *, stbi_uc *, int)");
  }
  if (out_n == 2) {
    for (p._4_4_ = 0; p._4_4_ < uVar2; p._4_4_ = p._4_4_ + 1) {
      sVar1 = 0xff;
      if (*local_38 == *tc) {
        sVar1 = '\0';
      }
      local_38[1] = sVar1;
      local_38 = local_38 + 2;
    }
  }
  else {
    for (p._4_4_ = 0; p._4_4_ < uVar2; p._4_4_ = p._4_4_ + 1) {
      if (((*local_38 == *tc) && (local_38[1] == tc[1])) && (local_38[2] == tc[2])) {
        local_38[3] = '\0';
      }
      local_38 = local_38 + 4;
    }
  }
  return 1;
}

Assistant:

static int stbi__compute_transparency(stbi__png *z, stbi_uc tc[3], int out_n)
{
   stbi__context *s = z->s;
   stbi__uint32 i, pixel_count = s->img_x * s->img_y;
   stbi_uc *p = z->out;

   // compute color-based transparency, assuming we've
   // already got 255 as the alpha value in the output
   STBI_ASSERT(out_n == 2 || out_n == 4);

   if (out_n == 2) {
      for (i=0; i < pixel_count; ++i) {
         p[1] = (p[0] == tc[0] ? 0 : 255);
         p += 2;
      }
   } else {
      for (i=0; i < pixel_count; ++i) {
         if (p[0] == tc[0] && p[1] == tc[1] && p[2] == tc[2])
            p[3] = 0;
         p += 4;
      }
   }
   return 1;
}